

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_AES.cpp
# Opt level: O2

void __thiscall ASDCP::HMACContext::h__HMACContext::Finalize(h__HMACContext *this)

{
  byte_t *md;
  ui32_t i;
  long lVar1;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  SHA_CTX SHA;
  
  SHA1_Init((SHA_CTX *)&SHA);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = *(undefined8 *)this->m_key;
  uStack_b0 = *(undefined8 *)(this->m_key + 8);
  SHA1_Init((SHA_CTX *)&SHA);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    *(byte *)((long)&local_b8 + lVar1) = *(byte *)((long)&local_b8 + lVar1) ^ 0x5c;
  }
  SHA1_Update((SHA_CTX *)&SHA,&local_b8,0x40);
  md = this->m_SHAValue;
  SHA1_Final(md,(SHA_CTX *)this);
  SHA1_Update((SHA_CTX *)&SHA,md,0x14);
  SHA1_Final(md,(SHA_CTX *)&SHA);
  this->m_Final = true;
  return;
}

Assistant:

void
  Finalize()
  {
    SHA_CTX SHA;
    SHA1_Init(&SHA);

    byte_t xor_buf[B_len];
    memset(xor_buf, 0, B_len);
    memcpy(xor_buf, m_key, KeyLen);

    SHA1_Init(&SHA);

    // H(K XOR opad, H(K XOR ipad, text))
    //   ^^^^^^^^^^
    for ( ui32_t i = 0; i < B_len; i++ )
      xor_buf[i] ^= opad_const;

    SHA1_Update(&SHA, xor_buf, B_len);

    // H(K XOR opad, H(K XOR ipad, text))
    //               ^
    SHA1_Final(m_SHAValue, &m_SHA);
    SHA1_Update(&SHA, m_SHAValue, HMAC_SIZE);

    // H(K XOR opad, H(K XOR ipad, text))
    // ^
    SHA1_Final(m_SHAValue, &SHA);
    m_Final = true;
  }